

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_cycler.cpp
# Opt level: O0

void __thiscall FCycler::Update(FCycler *this,float diff)

{
  float fVar1;
  float fVar2;
  float step;
  float angle;
  float mult;
  float diff_local;
  FCycler *this_local;
  
  fVar1 = this->m_end - this->m_start;
  if ((this->m_shouldCycle & 1U) != 0) {
    this->m_time = diff + this->m_time;
    if (this->m_cycle <= this->m_time) {
      this->m_time = this->m_cycle;
    }
    fVar2 = this->m_time / this->m_cycle;
    switch(this->m_cycleType) {
    case CYCLE_Linear:
      if ((this->m_increment & 1U) == 0) {
        this->m_current = this->m_end - fVar1 * fVar2;
      }
      else {
        this->m_current = this->m_start + fVar1 * fVar2;
      }
      break;
    case CYCLE_Sin:
      fVar2 = sinf(fVar2 * 6.2831855);
      this->m_current = this->m_start + fVar1 * ((fVar2 + 1.0) / 2.0);
      break;
    case CYCLE_Cos:
      fVar2 = cosf(fVar2 * 6.2831855);
      this->m_current = this->m_start + fVar1 * ((fVar2 + 1.0) / 2.0);
      break;
    case CYCLE_SawTooth:
      this->m_current = this->m_start + fVar1 * fVar2;
      break;
    case CYCLE_Square:
      if ((this->m_increment & 1U) == 0) {
        this->m_current = this->m_end;
      }
      else {
        this->m_current = this->m_start;
      }
    }
    if ((this->m_time == this->m_cycle) && (!NAN(this->m_time) && !NAN(this->m_cycle))) {
      this->m_time = 0.0;
      this->m_increment = (bool)((this->m_increment ^ 0xffU) & 1);
    }
  }
  return;
}

Assistant:

void FCycler::Update(float diff)
{
	float mult, angle;
	float step = m_end - m_start;
	
	if (!m_shouldCycle)
	{
		return;
	}
	
	m_time += diff;
	if (m_time >= m_cycle)
	{
		m_time = m_cycle;
	}
	
	mult = m_time / m_cycle;
	
	switch (m_cycleType)
	{
	case CYCLE_Linear:
		if (m_increment)
		{
			m_current = m_start + (step * mult);
		}
		else
		{
			m_current = m_end - (step * mult);
		}
		break;
	case CYCLE_Sin:
		angle = float(M_PI * 2.f * mult);
		mult = sinf(angle);
		mult = (mult + 1.f) / 2.f;
		m_current = m_start + (step * mult);
		break;
	case CYCLE_Cos:
		angle = float(M_PI * 2.f * mult);
		mult = cosf(angle);
		mult = (mult + 1.f) / 2.f;
		m_current = m_start + (step * mult);
		break;
	case CYCLE_SawTooth:
		m_current = m_start + (step * mult);
		break;
	case CYCLE_Square:
		if (m_increment)
		{
			m_current = m_start;
		}
		else
		{
			m_current = m_end;
		}
		break;
	}
	
	if (m_time == m_cycle)
	{
		m_time = 0.f;
		m_increment = !m_increment;
	}
}